

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool discrete_check(int a,double *b)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  double dVar5;
  
  uVar2 = 0;
  uVar3 = 0;
  if (0 < a) {
    uVar3 = (ulong)(uint)a;
  }
  pcVar4 = "  Negative probabilities not allowed.\n";
  do {
    if (uVar3 == uVar2) {
      dVar5 = r8vec_sum(a,b);
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        return true;
      }
      pcVar4 = "  Total probablity is zero.\n";
      break;
    }
    pdVar1 = b + uVar2;
    uVar2 = uVar2 + 1;
  } while (0.0 < *pdVar1 || *pdVar1 == 0.0);
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"DISCRETE_CHECK - Warning!\n");
  std::operator<<((ostream *)&std::cerr,pcVar4);
  return false;
}

Assistant:

bool discrete_check ( int a, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    DISCRETE_CHECK checks the parameters of the Discrete CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of probabilities assigned.
//
//    Input, double B[A], the relative probabilities of
//    outcomes 1 through A.  Each entry must be nonnegative.
//
//    Output, bool DISCRETE_CHECK, is true if the parameters are legal.
//
{
  double b_sum;
  int j;

  for ( j = 0; j < a; j++ )
  {
    if ( b[j] < 0.0 )
    {
      cerr << " \n";
      cerr << "DISCRETE_CHECK - Warning!\n";
      cerr << "  Negative probabilities not allowed.\n";
      return false;
    }
  }

  b_sum = r8vec_sum ( a, b );

  if ( b_sum == 0.0 )
  {
    cerr << " \n";
    cerr << "DISCRETE_CHECK - Warning!\n";
    cerr << "  Total probablity is zero.\n";
    return false;
  }

  return true;
}